

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O0

uint64_t __thiscall
kj::TimerImpl::timeoutToNextEvent::anon_class_24_3_1e08344b::operator()
          (anon_class_24_3_1e08344b *this,TimePoint nextTime)

{
  bool bVar1;
  Quantity<long,_kj::_::NanosecondLabel> local_48;
  long local_40 [2];
  ulong uStack_30;
  bool roundUp;
  uint64_t result;
  Duration timeout;
  anon_class_24_3_1e08344b *this_local;
  TimePoint nextTime_local;
  
  timeout.value = (long)this;
  this_local = (anon_class_24_3_1e08344b *)nextTime.value.value;
  bVar1 = Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator<=
                    ((Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
                     &this_local,this->start);
  if (bVar1) {
    nextTime_local.value.value = (Quantity<long,_kj::_::NanosecondLabel>)0;
  }
  else {
    result = (uint64_t)
             Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::operator-
                       ((Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> *)
                        &this_local,this->start);
    uStack_30 = Quantity<long,kj::_::NanosecondLabel>::operator/
                          ((Quantity<long,kj::_::NanosecondLabel> *)&result,this->unit);
    local_40[0] = (long)Quantity<long,_kj::_::NanosecondLabel>::operator%<long>
                                  ((Quantity<long,_kj::_::NanosecondLabel> *)&result,this->unit);
    local_48 = operator*<int,_long,_kj::_::NanosecondLabel,_void>
                         (0,(Quantity<long,_kj::_::NanosecondLabel>)0x3b9aca00);
    bVar1 = Quantity<long,kj::_::NanosecondLabel>::operator>
                      ((Quantity<long,kj::_::NanosecondLabel> *)local_40,&local_48);
    if (uStack_30 < *this->max) {
      nextTime_local.value.value = (Quantity<long,_kj::_::NanosecondLabel>)(uStack_30 + bVar1);
    }
    else {
      nextTime_local.value.value = (Quantity<long,_kj::_::NanosecondLabel>)*this->max;
    }
  }
  return nextTime_local.value.value.value;
}

Assistant:

Maybe<uint64_t> TimerImpl::timeoutToNextEvent(TimePoint start, Duration unit, uint64_t max) {
  return nextEvent().map([&](TimePoint nextTime) -> uint64_t {
    if (nextTime <= start) return 0;

    Duration timeout = nextTime - start;

    uint64_t result = timeout / unit;
    bool roundUp = timeout % unit > 0 * SECONDS;

    if (result >= max) {
      return max;
    } else {
      return result + roundUp;
    }
  });
}